

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qduplicatetracker_p.h
# Opt level: O3

void __thiscall
QDuplicateTracker<QString,32ul>::appendTo<QList<QString>>
          (QDuplicateTracker<QString,32ul> *this,QList<QString> *c)

{
  long in_FS_OFFSET;
  _Hashtable_ebo_helper<1,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_false> local_38;
  __buckets_ptr local_28;
  
  local_28 = *(__buckets_ptr *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x668) != 0) {
    do {
      std::
      unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
      ::extract((unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
                 *)&stack0xffffffffffffffc8,(const_iterator)((long)this + 0x640));
      if (local_38._M_tp.storedSeed == 0) {
        appendTo<QList<QString>>();
        goto LAB_00135760;
      }
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)c,(c->d).size,
                 (QString *)((long)local_38._M_tp.storedSeed + 8));
      QList<QString>::end(c);
      if (local_38._M_tp.storedSeed != 0) {
        std::
        _Node_handle_common<QString,_std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,_true>_>_>
        ::_M_reset((_Node_handle_common<QString,_std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,_true>_>_>
                    *)&stack0xffffffffffffffc8);
      }
    } while (*(long *)(this + 0x668) != 0);
  }
  if (*(__buckets_ptr *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_00135760:
  __stack_chk_fail();
}

Assistant:

void appendTo(C &c) &&
    {
        if constexpr (uses_pmr) {
            while (!set.empty())
                c.push_back(std::move(set.extract(set.begin()).value()));
        } else {
            return appendTo(c); // lvalue version
        }
    }